

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O3

void tb_clean_internal(void **p,int x)

{
  long lVar1;
  
  if (x < 2) {
    lVar1 = 0;
    do {
      if (p[lVar1] != (gpointer)0x0) {
        g_free(p[lVar1]);
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x400);
  }
  else {
    lVar1 = 0;
    do {
      if ((void **)p[lVar1] != (void **)0x0) {
        tb_clean_internal((void **)p[lVar1],x + -1);
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x400);
  }
  g_free(p);
  return;
}

Assistant:

static void tb_clean_internal(void **p, int x)
{
    int i;
    void **q;

    if (x <= 1) {
        for (i = 0; i < V_L2_SIZE; i++) {
            q = p[i];
            if (q) {
                g_free(q);
            }
        }
        g_free(p);
    } else {
        for (i = 0; i < V_L2_SIZE; i++) {
            q = p[i];
            if (q) {
                tb_clean_internal(q, x - 1);
            }
        }
        g_free(p);
    }
}